

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex.h
# Opt level: O2

void __thiscall
Gudhi::cubical_complex::
Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
~Bitmap_cubical_complex
          (Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
           *this)

{
  ~Bitmap_cubical_complex(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

virtual ~Bitmap_cubical_complex() {}